

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblock.h
# Opt level: O0

TPZFMatrix<std::complex<double>_> * __thiscall
TPZBlock::Matrix<std::complex<double>>(TPZBlock *this)

{
  ostream *this_00;
  long in_RDI;
  TPZFMatrix<std::complex<double>_> *tmp;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  TPZFMatrix<std::complex<double>_> *local_28;
  TPZFMatrix<std::complex<double>_> *local_8;
  
  if (*(long *)(in_RDI + 200) == 0) {
    local_28 = (TPZFMatrix<std::complex<double>_> *)0x0;
  }
  else {
    local_28 = (TPZFMatrix<std::complex<double>_> *)
               __dynamic_cast(*(long *)(in_RDI + 200),&TPZBaseMatrix::typeinfo,
                              &TPZFMatrix<std::complex<double>>::typeinfo,0);
  }
  if (local_28 == (TPZFMatrix<std::complex<double>_> *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Incompatible matrix type in ");
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "const TPZFMatrix<TVar> *TPZBlock::Matrix() const [TVar = std::complex<double>]"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
    local_8 = (TPZFMatrix<std::complex<double>_> *)0x0;
  }
  else {
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

const TPZFMatrix<TVar> *Matrix()const{
		if(auto tmp = dynamic_cast<const TPZFMatrix<TVar>*>(fpMatrix); tmp){
            return tmp;
        }
        else{
            PZError<<"Incompatible matrix type in ";
            PZError<<__PRETTY_FUNCTION__<<std::endl;
            DebugStop();
            return nullptr;
        }
	}